

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzrot::VariablesQbSetSpeed(ChNodeFEAxyzrot *this)

{
  double in_XMM0_Qa;
  
  VariablesQbSetSpeed((ChNodeFEAxyzrot *)
                      ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
                      (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-0x15]),in_XMM0_Qa);
  return;
}

Assistant:

void ChNodeFEAxyzrot::VariablesQbSetSpeed(double step) {
    ChCoordsys<> old_coord_dt = this->GetCoord_dt();

    // from 'qb' vector, sets body speed, and updates auxiliary data
    this->SetPos_dt(this->variables.Get_qb().segment(0, 3));
    this->SetWvel_loc(this->variables.Get_qb().segment(3, 3));

    // apply limits (if in speed clamping mode) to speeds.
    // ClampSpeed();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        this->SetPos_dtdt((this->GetCoord_dt().pos - old_coord_dt.pos) / step);
        this->SetRot_dtdt((this->GetCoord_dt().rot - old_coord_dt.rot) / step);
    }
}